

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O0

void OPLResetChip(FM_OPL *OPL)

{
  YM_DELTAT *DELTAT_00;
  long lVar1;
  YM_DELTAT *DELTAT;
  OPL_CH *CH;
  int local_18;
  int i;
  int s;
  int c;
  FM_OPL *OPL_local;
  
  OPL->eg_timer = 0;
  OPL->eg_cnt = 0;
  OPL->noise_rng = 1;
  OPL->mode = '\0';
  OPL_STATUS_RESET(OPL,0x7f);
  OPLWriteReg(OPL,'\x01','\0');
  OPLWriteReg(OPL,'\x02','\0');
  OPLWriteReg(OPL,'\x03','\0');
  OPLWriteReg(OPL,'\x04','\0');
  for (CH._4_4_ = 0xff; 0x1f < CH._4_4_; CH._4_4_ = CH._4_4_ + -1) {
    OPLWriteReg(OPL,(UINT8)CH._4_4_,'\0');
  }
  for (i = 0; i < 9; i = i + 1) {
    lVar1 = (long)i;
    for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
      OPL->P_CH[lVar1].SLOT[local_18].wavetable = 0;
      OPL->P_CH[lVar1].SLOT[local_18].state = '\0';
      OPL->P_CH[lVar1].SLOT[local_18].volume = 0x1ff;
    }
  }
  if ((OPL->type & 2) != 0) {
    DELTAT_00 = OPL->deltat;
    DELTAT_00->freqbase = OPL->freqbase;
    YM_DELTAT_ADPCM_Reset(DELTAT_00,0);
  }
  return;
}

Assistant:

static void OPLResetChip(FM_OPL *OPL)
{
	int c,s;
	int i;

	OPL->eg_timer = 0;
	OPL->eg_cnt   = 0;

	OPL->noise_rng = 1; /* noise shift register */
	OPL->mode   = 0;    /* normal mode */
	OPL_STATUS_RESET(OPL,0x7f);

	/* reset with register write */
	OPLWriteReg(OPL,0x01,0); /* wavesel disable */
	OPLWriteReg(OPL,0x02,0); /* Timer1 */
	OPLWriteReg(OPL,0x03,0); /* Timer2 */
	OPLWriteReg(OPL,0x04,0); /* IRQ mask clear */
	for(i = 0xff ; i >= 0x20 ; i-- ) OPLWriteReg(OPL,i,0);

	/* reset operator parameters */
	for( c = 0 ; c < 9 ; c++ )
	{
		OPL_CH *CH = &OPL->P_CH[c];
		for(s = 0 ; s < 2 ; s++ )
		{
			/* wave table */
			CH->SLOT[s].wavetable = 0;
			CH->SLOT[s].state     = EG_OFF;
			CH->SLOT[s].volume    = MAX_ATT_INDEX;
		}
	}
#if BUILD_Y8950
	if(OPL->type&OPL_TYPE_ADPCM)
	{
		YM_DELTAT *DELTAT = OPL->deltat;

		DELTAT->freqbase = OPL->freqbase;
		YM_DELTAT_ADPCM_Reset(DELTAT,0);
	}
#endif
}